

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.h
# Opt level: O0

ssize_t __thiscall
booster::locale::basic_message<char>::write
          (basic_message<char> *this,int __fd,void *__buf,size_t __n)

{
  ostream *poVar1;
  char *pcVar2;
  ssize_t sVar3;
  undefined4 in_register_00000034;
  string_type buffer;
  int id;
  locale *loc;
  ios_base *in_stack_ffffffffffffff68;
  string local_58 [52];
  uint local_24;
  locale local_20 [8];
  locale *local_18;
  ostream *local_10;
  basic_message<char> *local_8;
  
  local_10 = (ostream *)CONCAT44(in_register_00000034,__fd);
  local_8 = this;
  std::ios_base::getloc(in_stack_ffffffffffffff68);
  local_18 = local_20;
  booster::locale::ios_info::get((ios_base *)(local_10 + *(long *)(*(long *)local_10 + -0x18)));
  local_24 = booster::locale::ios_info::domain_id();
  std::__cxx11::string::string(local_58);
  poVar1 = local_10;
  pcVar2 = (char *)write(this,(int)local_18,(void *)(ulong)local_24,(size_t)local_58);
  std::operator<<(poVar1,pcVar2);
  std::__cxx11::string::~string(local_58);
  sVar3 = std::locale::~locale(local_20);
  return sVar3;
}

Assistant:

void write(std::basic_ostream<char_type> &out) const
            {
                std::locale const &loc = out.getloc();
                int id = ios_info::get(out).domain_id();
                string_type buffer;
                out << write(loc,id,buffer);
            }